

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O0

void gauden_norm_wt_var(vector_t ***in_var,vector_t ***wt_var,int32 pass2var,float32 ***dnom,
                       vector_t ***mean,uint32 n_mgau,uint32 n_feat,uint32 n_density,uint32 *veclen,
                       int32 tiedvar)

{
  uint32 *in_stack_ffffffffffffffb0;
  uint local_44;
  uint local_40;
  uint32 l;
  uint32 k;
  uint32 j;
  uint32 i;
  uint32 n_mgau_local;
  vector_t ***mean_local;
  float32 ***dnom_local;
  int32 pass2var_local;
  vector_t ***wt_var_local;
  vector_t ***in_var_local;
  
  if (tiedvar != 0) {
    in_stack_ffffffffffffffb0 = veclen;
    gauden_tie_vars_dnoms(wt_var,pass2var,dnom,mean,n_mgau,n_feat,n_density,veclen);
  }
  for (k = 0; k < n_mgau; k = k + 1) {
    for (l = 0; l < n_feat; l = l + 1) {
      for (local_40 = 0; local_40 < n_density; local_40 = local_40 + 1) {
        if (((float)dnom[k][l][local_40] != 0.0) || (NAN((float)dnom[k][l][local_40]))) {
          for (local_44 = 0; local_44 < veclen[l]; local_44 = local_44 + 1) {
            if (pass2var == 0) {
              wt_var[k][l][local_40][local_44] =
                   -mean[k][l][local_40][local_44] * mean[k][l][local_40][local_44] +
                   wt_var[k][l][local_40][local_44] / (float)dnom[k][l][local_40];
            }
            else {
              wt_var[k][l][local_40][local_44] =
                   wt_var[k][l][local_40][local_44] / (float)dnom[k][l][local_40];
            }
            if (wt_var[k][l][local_40][local_44] <= 0.0 && wt_var[k][l][local_40][local_44] != 0.0)
            {
              in_stack_ffffffffffffffb0 =
                   (uint32 *)CONCAT44((int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),local_44);
              err_msg(ERR_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                      ,0x694,
                      "Variance (mgau= %u, feat= %u, density=%u, component=%u) is less then 0. Most probably the number of senones is too high for such a small training database. Use smaller $CFG_N_TIED_STATES.\n"
                      ,(ulong)k,(ulong)l,local_40,in_stack_ffffffffffffffb0);
            }
          }
        }
        else if (in_var != (vector_t ***)0x0) {
          err_msg(ERR_INFO,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                  ,0x69b,"Copying unseen var (%u, %u, %u) from in_var\n",(ulong)k,(ulong)l,local_40)
          ;
          for (local_44 = 0; local_44 < veclen[l]; local_44 = local_44 + 1) {
            wt_var[k][l][local_40][local_44] = in_var[k][l][local_40][local_44];
          }
        }
      }
    }
  }
  return;
}

Assistant:

void
gauden_norm_wt_var(vector_t ***in_var,
		   vector_t ***wt_var,
		   int32 pass2var,
		   float32 ***dnom,
		   vector_t ***mean,
		   uint32 n_mgau,
		   uint32 n_feat,
		   uint32 n_density,
		   const uint32 *veclen,
		   int32 tiedvar)
{
    uint32 i, j, k, l;

    if (tiedvar) {
	gauden_tie_vars_dnoms(wt_var, pass2var, dnom, mean,
			      n_mgau, n_feat, n_density, veclen);
    }
    for (i = 0; i < n_mgau; i++) {
	for (j = 0; j < n_feat; j++) {
	    for (k = 0; k < n_density; k++) {
		if (dnom[i][j][k] != 0) {
		    for (l = 0; l < veclen[j]; l++) {
			if (!pass2var) {
			    wt_var[i][j][k][l] =
				(wt_var[i][j][k][l] / dnom[i][j][k]) -
				(mean[i][j][k][l] * mean[i][j][k][l]);
			}
			else {
			    wt_var[i][j][k][l] /= dnom[i][j][k];
			}

			if (wt_var[i][j][k][l] < 0) {
			    E_ERROR("Variance (mgau= %u, feat= %u, "
				    "density=%u, component=%u) is less then 0. "
				    "Most probably the number of senones is "
				    "too high for such a small training "
				    "database. Use smaller $CFG_N_TIED_STATES.\n",
				    i, j, k, l);
			}
		    }
		}
		else {
		    if (in_var) {
			E_INFO("Copying unseen var (%u, %u, %u) from in_var\n",
			       i, j, k);
			for (l = 0; l < veclen[j]; l++) {
			    wt_var[i][j][k][l] = in_var[i][j][k][l];
			}
		    }
		}
	    }
	}
    }
}